

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_information_block(archive_write *a)

{
  time_t *__timer;
  int iVar1;
  archive_string *paVar2;
  uchar *__dest;
  size_t info_size;
  archive_string info;
  int r;
  int opt;
  char *v;
  char buf [128];
  iso9660_conflict *iso9660;
  archive_write *a_local;
  
  __timer = (time_t *)a->format_data;
  if (*(ulong *)((long)a->format_data + 0x102e0) < 0x800) {
    iVar1 = wb_write_out(a);
    if (iVar1 != 0) {
      return iVar1;
    }
    info.buffer_length._0_4_ = 0;
  }
  info_size = 0;
  info.s = (char *)0x0;
  info.length = 0;
  paVar2 = archive_string_ensure((archive_string *)&info_size,0x800);
  if (paVar2 == (archive_string *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
    a_local._4_4_ = -0x1e;
  }
  else {
    memset((void *)info_size,0,0x800);
    info.buffer_length._4_4_ = 0;
    ctime_r(__timer,(char *)&v);
    archive_version_string();
    archive_string_sprintf((archive_string *)&info_size,"INFO %s%s",&v);
    if ((*(uint *)(__timer + 0x206e) & 1) != 0) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "abstract-file",KEY_STR,__timer[0x34]);
    }
    if ((*(uint *)(__timer + 0x206e) >> 1 & 1) != 0) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "application-id",KEY_STR,__timer[0x2e]);
    }
    if ((*(uint *)(__timer + 0x206e) >> 2 & 1) != 1) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "allow-vernum",KEY_FLG,(ulong)(*(uint *)(__timer + 0x206e) >> 2 & 1));
    }
    if ((*(uint *)(__timer + 0x206e) >> 3 & 1) != 0) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "biblio-file",KEY_STR,__timer[0x37]);
    }
    if ((*(uint *)(__timer + 0x206e) >> 4 & 1) != 0) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),"boot",
                      KEY_STR,__timer[0x2065]);
    }
    if ((*(uint *)(__timer + 0x206e) >> 5 & 1) != 0) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "boot-catalog",KEY_STR,__timer[0x2061]);
    }
    if ((*(uint *)(__timer + 0x206e) >> 6 & 1) != 0) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "boot-info-table",KEY_FLG,(ulong)(*(uint *)(__timer + 0x206e) >> 6 & 1));
    }
    if ((*(uint *)(__timer + 0x206e) >> 7 & 1) != 0) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "boot-load-seg",KEY_HEX,(ulong)*(ushort *)((long)__timer + 0x1036a));
    }
    if ((*(uint *)(__timer + 0x206e) >> 8 & 1) != 0) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "boot-load-size",KEY_INT,(ulong)*(ushort *)((long)__timer + 0x1036c));
    }
    if ((*(uint *)(__timer + 0x206e) >> 9 & 3) != 0) {
      _r = "no-emulation";
      if ((*(uint *)(__timer + 0x206e) >> 9 & 3) == 2) {
        _r = "fd";
      }
      if ((*(uint *)(__timer + 0x206e) >> 9 & 3) == 3) {
        _r = "hard-disk";
      }
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "boot-type",KEY_STR,_r);
    }
    if ((*(uint *)(__timer + 0x206e) >> 0xb & 1) != 0) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "compression-level",KEY_INT,(ulong)*(uint *)(__timer + 0x59));
    }
    if ((*(uint *)(__timer + 0x206e) >> 0xc & 1) != 0) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "copyright-file",KEY_STR,__timer[0x31]);
    }
    if ((*(uint *)(__timer + 0x206e) >> 0xe & 7) != 1) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "iso-level",KEY_INT,(ulong)(*(uint *)(__timer + 0x206e) >> 0xe & 7));
    }
    if ((*(uint *)(__timer + 0x206e) >> 0x11 & 3) != 1) {
      if ((*(uint *)(__timer + 0x206e) >> 0x11 & 3) == 2) {
        set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),"joliet"
                        ,KEY_STR,"long");
      }
      else {
        set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),"joliet"
                        ,KEY_FLG,(ulong)(*(uint *)(__timer + 0x206e) >> 0x11 & 3));
      }
    }
    if ((*(uint *)(__timer + 0x206e) >> 0x13 & 1) != 1) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "limit-depth",KEY_FLG,(ulong)(*(uint *)(__timer + 0x206e) >> 0x13 & 1));
    }
    if ((*(uint *)(__timer + 0x206e) >> 0x14 & 1) != 1) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "limit-dirs",KEY_FLG,(ulong)(*(uint *)(__timer + 0x206e) >> 0x14 & 1));
    }
    if ((*(uint *)(__timer + 0x206e) >> 0x15 & 1) != 1) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),"pad",
                      KEY_FLG,(ulong)(*(uint *)(__timer + 0x206e) >> 0x15 & 1));
    }
    if ((*(uint *)(__timer + 0x206e) >> 0x16 & 1) != 0) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "publisher",KEY_STR,__timer[0x28]);
    }
    if ((*(uint *)(__timer + 0x206e) >> 0x17 & 3) != 2) {
      if ((*(uint *)(__timer + 0x206e) >> 0x17 & 3) == 0) {
        set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                        "rockridge",KEY_FLG,(ulong)(*(uint *)(__timer + 0x206e) >> 0x17 & 3));
      }
      else if ((*(uint *)(__timer + 0x206e) >> 0x17 & 3) == 1) {
        set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                        "rockridge",KEY_STR,"strict");
      }
      else if ((*(uint *)(__timer + 0x206e) >> 0x17 & 3) == 2) {
        set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                        "rockridge",KEY_STR,"useful");
      }
    }
    if ((*(uint *)(__timer + 0x206e) >> 0x19 & 1) != 0) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),
                      "volume-id",KEY_STR,__timer[0x25]);
    }
    if ((*(uint *)(__timer + 0x206e) >> 0x1a & 1) != 0) {
      set_option_info((archive_string *)&info_size,(int *)((long)&info.buffer_length + 4),"zisofs",
                      KEY_FLG,(ulong)(*(uint *)(__timer + 0x206e) >> 0x1a & 1));
    }
    __dest = wb_buffptr(a);
    memcpy(__dest,(void *)info_size,0x800);
    archive_string_free((archive_string *)&info_size);
    a_local._4_4_ = wb_consume(a,0x800);
  }
  return a_local._4_4_;
}

Assistant:

static int
write_information_block(struct archive_write *a)
{
	struct iso9660 *iso9660;
	char buf[128];
	const char *v;
	int opt, r;
	struct archive_string info;
	size_t info_size = LOGICAL_BLOCK_SIZE *
			       NON_ISO_FILE_SYSTEM_INFORMATION_BLOCK;

	iso9660 = (struct iso9660 *)a->format_data;
	if (info_size > wb_remaining(a)) {
		r = wb_write_out(a);
		if (r != ARCHIVE_OK)
			return (r);
	}
	archive_string_init(&info);
	if (archive_string_ensure(&info, info_size) == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	memset(info.s, 0, info_size);
	opt = 0;
#if defined(HAVE__CTIME64_S)
	_ctime64_s(buf, sizeof(buf), &(iso9660->birth_time));
#elif defined(HAVE_CTIME_R)
	ctime_r(&(iso9660->birth_time), buf);
#else
	strncpy(buf, ctime(&(iso9660->birth_time)), sizeof(buf)-1);
	buf[sizeof(buf)-1] = '\0';
#endif
	archive_string_sprintf(&info,
	    "INFO %s%s", buf, archive_version_string());
	if (iso9660->opt.abstract_file != OPT_ABSTRACT_FILE_DEFAULT)
		set_option_info(&info, &opt, "abstract-file",
		    KEY_STR, iso9660->abstract_file_identifier.s);
	if (iso9660->opt.application_id != OPT_APPLICATION_ID_DEFAULT)
		set_option_info(&info, &opt, "application-id",
		    KEY_STR, iso9660->application_identifier.s);
	if (iso9660->opt.allow_vernum != OPT_ALLOW_VERNUM_DEFAULT)
		set_option_info(&info, &opt, "allow-vernum",
		    KEY_FLG, iso9660->opt.allow_vernum);
	if (iso9660->opt.biblio_file != OPT_BIBLIO_FILE_DEFAULT)
		set_option_info(&info, &opt, "biblio-file",
		    KEY_STR, iso9660->bibliographic_file_identifier.s);
	if (iso9660->opt.boot != OPT_BOOT_DEFAULT)
		set_option_info(&info, &opt, "boot",
		    KEY_STR, iso9660->el_torito.boot_filename.s);
	if (iso9660->opt.boot_catalog != OPT_BOOT_CATALOG_DEFAULT)
		set_option_info(&info, &opt, "boot-catalog",
		    KEY_STR, iso9660->el_torito.catalog_filename.s);
	if (iso9660->opt.boot_info_table != OPT_BOOT_INFO_TABLE_DEFAULT)
		set_option_info(&info, &opt, "boot-info-table",
		    KEY_FLG, iso9660->opt.boot_info_table);
	if (iso9660->opt.boot_load_seg != OPT_BOOT_LOAD_SEG_DEFAULT)
		set_option_info(&info, &opt, "boot-load-seg",
		    KEY_HEX, iso9660->el_torito.boot_load_seg);
	if (iso9660->opt.boot_load_size != OPT_BOOT_LOAD_SIZE_DEFAULT)
		set_option_info(&info, &opt, "boot-load-size",
		    KEY_INT, iso9660->el_torito.boot_load_size);
	if (iso9660->opt.boot_type != OPT_BOOT_TYPE_DEFAULT) {
		v = "no-emulation";
		if (iso9660->opt.boot_type == OPT_BOOT_TYPE_FD)
			v = "fd";
		if (iso9660->opt.boot_type == OPT_BOOT_TYPE_HARD_DISK)
			v = "hard-disk";
		set_option_info(&info, &opt, "boot-type",
		    KEY_STR, v);
	}
#ifdef HAVE_ZLIB_H
	if (iso9660->opt.compression_level != OPT_COMPRESSION_LEVEL_DEFAULT)
		set_option_info(&info, &opt, "compression-level",
		    KEY_INT, iso9660->zisofs.compression_level);
#endif
	if (iso9660->opt.copyright_file != OPT_COPYRIGHT_FILE_DEFAULT)
		set_option_info(&info, &opt, "copyright-file",
		    KEY_STR, iso9660->copyright_file_identifier.s);
	if (iso9660->opt.iso_level != OPT_ISO_LEVEL_DEFAULT)
		set_option_info(&info, &opt, "iso-level",
		    KEY_INT, iso9660->opt.iso_level);
	if (iso9660->opt.joliet != OPT_JOLIET_DEFAULT) {
		if (iso9660->opt.joliet == OPT_JOLIET_LONGNAME)
			set_option_info(&info, &opt, "joliet",
			    KEY_STR, "long");
		else
			set_option_info(&info, &opt, "joliet",
			    KEY_FLG, iso9660->opt.joliet);
	}
	if (iso9660->opt.limit_depth != OPT_LIMIT_DEPTH_DEFAULT)
		set_option_info(&info, &opt, "limit-depth",
		    KEY_FLG, iso9660->opt.limit_depth);
	if (iso9660->opt.limit_dirs != OPT_LIMIT_DIRS_DEFAULT)
		set_option_info(&info, &opt, "limit-dirs",
		    KEY_FLG, iso9660->opt.limit_dirs);
	if (iso9660->opt.pad != OPT_PAD_DEFAULT)
		set_option_info(&info, &opt, "pad",
		    KEY_FLG, iso9660->opt.pad);
	if (iso9660->opt.publisher != OPT_PUBLISHER_DEFAULT)
		set_option_info(&info, &opt, "publisher",
		    KEY_STR, iso9660->publisher_identifier.s);
	if (iso9660->opt.rr != OPT_RR_DEFAULT) {
		if (iso9660->opt.rr == OPT_RR_DISABLED)
			set_option_info(&info, &opt, "rockridge",
			    KEY_FLG, iso9660->opt.rr);
		else if (iso9660->opt.rr == OPT_RR_STRICT)
			set_option_info(&info, &opt, "rockridge",
			    KEY_STR, "strict");
		else if (iso9660->opt.rr == OPT_RR_USEFUL)
			set_option_info(&info, &opt, "rockridge",
			    KEY_STR, "useful");
	}
	if (iso9660->opt.volume_id != OPT_VOLUME_ID_DEFAULT)
		set_option_info(&info, &opt, "volume-id",
		    KEY_STR, iso9660->volume_identifier.s);
	if (iso9660->opt.zisofs != OPT_ZISOFS_DEFAULT)
		set_option_info(&info, &opt, "zisofs",
		    KEY_FLG, iso9660->opt.zisofs);

	memcpy(wb_buffptr(a), info.s, info_size);
	archive_string_free(&info);
	return (wb_consume(a, info_size));
}